

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O1

void encode_bc7_block(void *pBlock,bc7_optimization_results *pResults)

{
  byte *pbVar1;
  byte bVar2;
  undefined1 uVar3;
  uint uVar4;
  undefined4 uVar5;
  uint32_t uVar6;
  char cVar7;
  byte bVar8;
  uint32_t i;
  uint uVar9;
  uint8_t *puVar10;
  long lVar11;
  uint32_t i_1;
  uint8_t *puVar12;
  uint uVar13;
  uint8_t *puVar14;
  undefined8 *puVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint32_t x;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  undefined8 *puVar25;
  uint32_t pbits [3] [2];
  undefined8 local_b8;
  uint local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined8 local_98;
  undefined4 local_90;
  uint local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  ulong local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  uint32_t auStack_58 [2];
  color_quad_u8 high [3];
  color_quad_u8 low [3];
  uint8_t color_selectors [16];
  uint8_t alpha_selectors [16];
  
  uVar4 = pResults->m_mode;
  uVar19 = (ulong)uVar4;
  bVar2 = "\x03\x02\x03\x02\x01\x01\x01\x02"[uVar19];
  if (uVar19 - 4 < 3) {
    puVar14 = "";
  }
  else {
    if ((0x8aUL >> (uVar19 & 0x3f) & 1) == 0) {
      puVar14 = "";
    }
    else {
      puVar14 = "";
    }
    puVar14 = puVar14 + (pResults->m_partition << 4);
  }
  local_88 = *(undefined8 *)pResults->m_selectors;
  uStack_80 = *(undefined8 *)(pResults->m_selectors + 8);
  local_68 = *(undefined8 *)pResults->m_alpha_selectors;
  uStack_60 = *(undefined8 *)(pResults->m_alpha_selectors + 8);
  puVar15 = &local_98;
  local_98 = *(undefined8 *)pResults->m_low;
  local_90 = *(undefined4 *)pResults->m_low[2].m_c;
  puVar25 = &local_a8;
  local_a8 = *(undefined8 *)pResults->m_high;
  local_a0 = *(undefined4 *)pResults->m_high[2].m_c;
  stack0xffffffffffffffb8 = pResults->m_pbits[2];
  auStack_58 = pResults->m_pbits[0];
  high._0_8_ = pResults->m_pbits[1];
  local_b0 = 0xffffffff;
  local_b8 = 0xffffffffffffffff;
  cVar7 = (char)pResults->m_index_selector;
  uVar22 = 1 << ("\x03\x03\x02\x02\x02\x02\x04\x02"[(int)uVar4] + cVar7 & 0x1f);
  local_70 = (ulong)bVar2;
  uVar24 = 0;
  do {
    if (uVar24 == 0) {
      bVar8 = 0;
    }
    else {
      puVar10 = 
      "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x02\b\x02\x02\b\b\x0f\x02\b\x02\x02\b\b\x02\x02\x0f\x0f\x06\b\x02\b\x0f\x0f\x02\b\x02\x02\x02\x0f\x0f\x06\x06\x02\x06\b\x0f\x0f\x02\x02\x0f\x0f\x0f\x0f\x0f\x02\x02\x0f"
      ;
      if (uVar24 == 2) {
        puVar10 = 
        "\x0f\b\b\x03\x0f\x0f\x03\b\x0f\x0f\x0f\x0f\x0f\x0f\x0f\b\x0f\b\x0f\x03\x0f\b\x0f\b\x03\x0f\x06\n\x0f\x0f\n\b\x0f\x03\x0f\n\n\b\t\n\x06\x0f\b\x0f\x03\x06\x06\b\x0f\x03\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x03\x0f\x0f\b"
        ;
      }
      if ((uVar4 & 0xfffffffd) != 0) {
        puVar10 = 
        "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x02\b\x02\x02\b\b\x0f\x02\b\x02\x02\b\b\x02\x02\x0f\x0f\x06\b\x02\b\x0f\x0f\x02\b\x02\x02\x02\x0f\x0f\x06\x06\x02\x06\b\x0f\x0f\x02\x02\x0f\x0f\x0f\x0f\x0f\x02\x02\x0f"
        ;
      }
      puVar12 = puVar10;
      if (uVar24 == 1) {
        puVar12 = 
        "\x03\x03\x0f\x0f\b\x03\x0f\x0f\b\b\x06\x06\x06\x05\x03\x03\x03\x03\b\x0f\x03\x03\x06\n\x05\b\b\x06\b\x05\x0f\x0f\b\x0f\x03\x05\x06\n\b\x0f\x0f\x03\x0f\x05\x0f\x0f\x0f\x0f\x03\x0f\x05\x05\x05\b\x05\n\x05\n\b\r\x0f\f\x03\x03"
        ;
      }
      if ((uVar4 & 0xfffffffd) != 0) {
        puVar12 = puVar10;
      }
      bVar8 = puVar12[pResults->m_partition];
    }
    *(uint *)((long)&local_b8 + uVar24 * 4) = (uint)bVar8;
    if ((uVar22 >> 1 & (uint)*(byte *)((long)&local_88 + (ulong)bVar8)) != 0) {
      lVar11 = 0;
      do {
        if (uVar24 == puVar14[lVar11]) {
          *(byte *)((long)&local_88 + lVar11) = ~*(byte *)((long)&local_88 + lVar11) + (char)uVar22;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x10);
      if ((uVar4 & 0xfffffffe) == 4) {
        lVar11 = 0;
        do {
          uVar3 = *(undefined1 *)((long)puVar15 + lVar11);
          *(undefined1 *)((long)puVar15 + lVar11) = *(undefined1 *)((long)puVar25 + lVar11);
          *(undefined1 *)((long)puVar25 + lVar11) = uVar3;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
      }
      else {
        uVar5 = *(undefined4 *)((long)&local_98 + uVar24 * 4);
        *(undefined4 *)((long)&local_98 + uVar24 * 4) =
             *(undefined4 *)((long)&local_a8 + uVar24 * 4);
        *(undefined4 *)((long)&local_a8 + uVar24 * 4) = uVar5;
      }
      if (uVar4 != 1) {
        *(ulong *)(high + uVar24 * 2 + -2) =
             CONCAT44((int)*(undefined8 *)(high + uVar24 * 2 + -2),
                      (int)((ulong)*(undefined8 *)(high + uVar24 * 2 + -2) >> 0x20));
      }
    }
    if (((uVar4 & 0xfffffffe) == 4) &&
       (uVar9 = 1 << (""[(int)uVar4] - cVar7 & 0x1f),
       (uVar9 >> 1 & (uint)*(byte *)((long)&local_68 + (ulong)bVar8)) != 0)) {
      lVar11 = 0;
      do {
        if (uVar24 == puVar14[lVar11]) {
          *(byte *)((long)&local_68 + lVar11) = ~*(byte *)((long)&local_68 + lVar11) + (char)uVar9;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x10);
      uVar3 = *(undefined1 *)((long)&local_98 + uVar24 * 4 + 3);
      *(undefined1 *)((long)&local_98 + uVar24 * 4 + 3) =
           *(undefined1 *)((long)&local_a8 + uVar24 * 4 + 3);
      *(undefined1 *)((long)&local_a8 + uVar24 * 4 + 3) = uVar3;
    }
    uVar24 = uVar24 + 1;
    puVar15 = (undefined8 *)((long)puVar15 + 4);
    puVar25 = (undefined8 *)((long)puVar25 + 4);
  } while (uVar24 != (uint)bVar2 + (uint)(bVar2 == 0));
  *(undefined1 (*) [16])pBlock = (undefined1  [16])0x0;
  uVar24 = 0;
  uVar22 = uVar4 + 1;
  if (uVar22 != 0) {
    uVar16 = 1 << ((byte)uVar4 & 0x1f);
    uVar9 = 0;
    do {
      uVar13 = 8 - (uVar9 & 7);
      if (uVar22 <= uVar13) {
        uVar13 = uVar22;
      }
      uVar24 = (ulong)(uVar13 + uVar9);
      pbVar1 = (byte *)((long)pBlock + (ulong)(uVar9 >> 3));
      *pbVar1 = *pbVar1 | (byte)(uVar16 << (sbyte)(uVar9 & 7));
      uVar16 = uVar16 >> ((byte)uVar13 & 0x1f);
      uVar22 = uVar22 - uVar13;
      uVar9 = uVar13 + uVar9;
    } while (uVar22 != 0);
  }
  local_8c = uVar4 & 0xfffffffe;
  if (local_8c == 4) {
    uVar22 = pResults->m_rotation;
    uVar9 = 2;
    uVar18 = uVar24;
    do {
      uVar13 = (uint)uVar18 & 7;
      uVar16 = 8 - uVar13;
      if (uVar9 <= uVar16) {
        uVar16 = uVar9;
      }
      uVar17 = uVar16 + (uint)uVar18;
      uVar24 = (ulong)uVar17;
      pbVar1 = (byte *)((long)pBlock + (uVar18 >> 3));
      *pbVar1 = *pbVar1 | (byte)(uVar22 << (sbyte)uVar13);
      uVar22 = uVar22 >> ((byte)uVar16 & 0x1f);
      uVar18 = (ulong)uVar17;
      uVar9 = uVar9 - uVar16;
    } while (uVar9 != 0);
  }
  if (uVar4 == 4) {
    pbVar1 = (byte *)((long)pBlock + (uVar24 >> 3));
    *pbVar1 = *pbVar1 | (byte)(pResults->m_index_selector << ((byte)uVar24 & 7));
    uVar24 = (ulong)((int)uVar24 + 1);
  }
  if (2 < uVar19 - 4) {
    uVar22 = pResults->m_partition;
    uVar9 = (uint)((0x8eUL >> (uVar19 & 0x3f) & 1) != 0) * 2 + 4;
    uVar18 = uVar24;
    do {
      uVar13 = (uint)uVar18 & 7;
      uVar16 = 8 - uVar13;
      if (uVar9 <= uVar16) {
        uVar16 = uVar9;
      }
      uVar24 = (ulong)(uVar16 + (uint)uVar18);
      pbVar1 = (byte *)((long)pBlock + (uVar18 >> 3));
      *pbVar1 = *pbVar1 | (byte)(uVar22 << (sbyte)uVar13);
      uVar22 = uVar22 >> ((byte)uVar16 & 0x1f);
      uVar9 = uVar9 - uVar16;
      uVar18 = uVar24;
    } while (uVar9 != 0);
  }
  iVar23 = (int)local_70;
  lVar11 = 0;
  do {
    uVar18 = 0;
    do {
      if (lVar11 == 3) {
        uVar22 = (uint)""[uVar19];
      }
      else {
        uVar22 = (uint)"\x04\x06\x05\a\x05\a\a\x05"[uVar19];
      }
      if (uVar22 != 0) {
        uVar9 = (uint)*(byte *)((long)&local_98 + uVar18 * 4 + lVar11);
        uVar20 = uVar24;
        do {
          uVar13 = (uint)uVar20 & 7;
          uVar16 = 8 - uVar13;
          if (uVar22 <= uVar16) {
            uVar16 = uVar22;
          }
          uVar17 = uVar16 + (uint)uVar20;
          uVar24 = (ulong)uVar17;
          pbVar1 = (byte *)((long)pBlock + (uVar20 >> 3));
          *pbVar1 = *pbVar1 | (byte)(uVar9 << (sbyte)uVar13);
          uVar9 = uVar9 >> ((byte)uVar16 & 0x1f);
          uVar20 = (ulong)uVar17;
          uVar22 = uVar22 - uVar16;
        } while (uVar22 != 0);
      }
      if (lVar11 == 3) {
        uVar22 = (uint)""[uVar19];
      }
      else {
        uVar22 = (uint)"\x04\x06\x05\a\x05\a\a\x05"[uVar19];
      }
      if (uVar22 != 0) {
        uVar9 = (uint)*(byte *)((long)&local_a8 + uVar18 * 4 + lVar11);
        uVar20 = uVar24;
        do {
          uVar13 = (uint)uVar20 & 7;
          uVar16 = 8 - uVar13;
          if (uVar22 <= uVar16) {
            uVar16 = uVar22;
          }
          uVar24 = (ulong)(uVar16 + (uint)uVar20);
          pbVar1 = (byte *)((long)pBlock + (uVar20 >> 3));
          *pbVar1 = *pbVar1 | (byte)(uVar9 << (sbyte)uVar13);
          uVar9 = uVar9 >> ((byte)uVar16 & 0x1f);
          uVar22 = uVar22 - uVar16;
          uVar20 = uVar24;
        } while (uVar22 != 0);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != iVar23 + (uint)(iVar23 == 0));
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4 - (ulong)(uVar4 < 4));
  if ((0x34UL >> (uVar19 & 0x3f) & 1) == 0) {
    uVar18 = 0;
    do {
      pbVar1 = (byte *)((long)pBlock + (uVar24 >> 3));
      *pbVar1 = *pbVar1 | (byte)(*(int *)high[uVar18 * 2 + -2].m_c << ((byte)uVar24 & 7));
      uVar22 = (int)uVar24 + 1;
      if (uVar4 != 1) {
        pbVar1 = (byte *)((long)pBlock + (ulong)(uVar22 >> 3));
        *pbVar1 = *pbVar1 | (byte)(*(int *)high[uVar18 * 2 + -1].m_c << ((byte)uVar22 & 7));
        uVar22 = (int)uVar24 + 2;
      }
      uVar18 = uVar18 + 1;
      uVar24 = (ulong)uVar22;
    } while (iVar23 + (uint)(iVar23 == 0) != uVar18);
  }
  else {
    uVar22 = (uint)uVar24;
  }
  lVar11 = 0;
  do {
    lVar21 = 0;
    do {
      uVar6 = pResults->m_index_selector;
      if (uVar6 == 0) {
        uVar9 = (uint)"\x03\x03\x02\x02\x02\x02\x04\x02"[(int)uVar4];
      }
      else {
        uVar9 = ""[(int)uVar4] - uVar6;
      }
      uVar24 = lVar21 + lVar11 * 4;
      uVar9 = uVar9 - (uVar24 == local_b0 ||
                      (uVar24 == local_b8._4_4_ || uVar24 == (local_b8 & 0xffffffff)));
      if (uVar9 != 0) {
        puVar15 = &local_68;
        if (uVar6 == 0) {
          puVar15 = &local_88;
        }
        uVar13 = (uint)*(byte *)((long)puVar15 + uVar24);
        uVar16 = uVar22;
        do {
          uVar17 = 8 - (uVar16 & 7);
          if (uVar9 <= uVar17) {
            uVar17 = uVar9;
          }
          uVar22 = uVar17 + uVar16;
          pbVar1 = (byte *)((long)pBlock + (ulong)(uVar16 >> 3));
          *pbVar1 = *pbVar1 | (byte)(uVar13 << (sbyte)(uVar16 & 7));
          uVar13 = uVar13 >> ((byte)uVar17 & 0x1f);
          uVar9 = uVar9 - uVar17;
          uVar16 = uVar22;
        } while (uVar9 != 0);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != 4);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  if (local_8c == 4) {
    lVar11 = 0;
    do {
      lVar21 = 0;
      do {
        uVar6 = pResults->m_index_selector;
        if (uVar6 == 0) {
          uVar9 = (uint)""[uVar19];
        }
        else {
          uVar9 = "\x03\x03\x02\x02\x02\x02\x04\x02"[(int)uVar4] + uVar6;
        }
        uVar24 = lVar21 + lVar11 * 4;
        uVar9 = uVar9 - (uVar24 == local_b0 ||
                        (uVar24 == local_b8._4_4_ || uVar24 == (local_b8 & 0xffffffff)));
        if (uVar9 != 0) {
          puVar15 = &local_88;
          if (uVar6 == 0) {
            puVar15 = &local_68;
          }
          uVar13 = (uint)*(byte *)((long)puVar15 + uVar24);
          uVar16 = uVar22;
          do {
            uVar17 = 8 - (uVar16 & 7);
            if (uVar9 <= uVar17) {
              uVar17 = uVar9;
            }
            uVar22 = uVar17 + uVar16;
            pbVar1 = (byte *)((long)pBlock + (ulong)(uVar16 >> 3));
            *pbVar1 = *pbVar1 | (byte)(uVar13 << (sbyte)(uVar16 & 7));
            uVar13 = uVar13 >> ((byte)uVar17 & 0x1f);
            uVar9 = uVar9 - uVar17;
            uVar16 = uVar22;
          } while (uVar9 != 0);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 4);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
  }
  return;
}

Assistant:

static void encode_bc7_block(void* pBlock, const bc7_optimization_results* pResults)
{
	assert(pResults->m_index_selector <= 1);
	assert(pResults->m_rotation <= 3);

	const uint32_t best_mode = pResults->m_mode;

	const uint32_t total_subsets = g_bc7_num_subsets[best_mode];
	const uint32_t total_partitions = 1 << g_bc7_partition_bits[best_mode];
	//const uint32_t num_rotations = 1 << g_bc7_rotation_bits[best_mode];
	//const uint32_t num_index_selectors = (best_mode == 4) ? 2 : 1;

	const uint8_t* pPartition;
	if (total_subsets == 1)
		pPartition = &g_bc7_partition1[0];
	else if (total_subsets == 2)
		pPartition = &g_bc7_partition2[pResults->m_partition * 16];
	else
		pPartition = &g_bc7_partition3[pResults->m_partition * 16];

	uint8_t color_selectors[16];
	memcpy(color_selectors, pResults->m_selectors, 16);

	uint8_t alpha_selectors[16];
	memcpy(alpha_selectors, pResults->m_alpha_selectors, 16);

	color_quad_u8 low[3], high[3];
	memcpy(low, pResults->m_low, sizeof(low));
	memcpy(high, pResults->m_high, sizeof(high));

	uint32_t pbits[3][2];
	memcpy(pbits, pResults->m_pbits, sizeof(pbits));

	int anchor[3] = { -1, -1, -1 };

	for (uint32_t k = 0; k < total_subsets; k++)
	{
		uint32_t anchor_index = 0;
		if (k)
		{
			if ((total_subsets == 3) && (k == 1))
				anchor_index = g_bc7_table_anchor_index_third_subset_1[pResults->m_partition];
			else if ((total_subsets == 3) && (k == 2))
				anchor_index = g_bc7_table_anchor_index_third_subset_2[pResults->m_partition];
			else
				anchor_index = g_bc7_table_anchor_index_second_subset[pResults->m_partition];
		}

		anchor[k] = anchor_index;

		const uint32_t color_index_bits = get_bc7_color_index_size(best_mode, pResults->m_index_selector);
		const uint32_t num_color_indices = 1 << color_index_bits;

		if (color_selectors[anchor_index] & (num_color_indices >> 1))
		{
			for (uint32_t i = 0; i < 16; i++)
				if (pPartition[i] == k)
					color_selectors[i] = (uint8_t)((num_color_indices - 1) - color_selectors[i]);

			if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
			{
				for (uint32_t q = 0; q < 3; q++)
				{
					uint8_t t = low[k].m_c[q];
					low[k].m_c[q] = high[k].m_c[q];
					high[k].m_c[q] = t;
				}
			}
			else
			{
				color_quad_u8 tmp = low[k];
				low[k] = high[k];
				high[k] = tmp;
			}

			if (!g_bc7_mode_has_shared_p_bits[best_mode])
			{
				uint32_t t = pbits[k][0];
				pbits[k][0] = pbits[k][1];
				pbits[k][1] = t;
			}
		}

		if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
		{
			const uint32_t alpha_index_bits = get_bc7_alpha_index_size(best_mode, pResults->m_index_selector);
			const uint32_t num_alpha_indices = 1 << alpha_index_bits;

			if (alpha_selectors[anchor_index] & (num_alpha_indices >> 1))
			{
				for (uint32_t i = 0; i < 16; i++)
					if (pPartition[i] == k)
						alpha_selectors[i] = (uint8_t)((num_alpha_indices - 1) - alpha_selectors[i]);

				uint8_t t = low[k].m_c[3];
				low[k].m_c[3] = high[k].m_c[3];
				high[k].m_c[3] = t;
			}
		}
	}

	uint8_t* pBlock_bytes = (uint8_t*)(pBlock);
	memset(pBlock_bytes, 0, BC7ENC_BLOCK_SIZE);

	uint32_t cur_bit_ofs = 0;
	set_block_bits(pBlock_bytes, 1 << best_mode, best_mode + 1, &cur_bit_ofs);

	if ((best_mode == 4) || (best_mode == 5))
		set_block_bits(pBlock_bytes, pResults->m_rotation, 2, &cur_bit_ofs);

	if (best_mode == 4)
		set_block_bits(pBlock_bytes, pResults->m_index_selector, 1, &cur_bit_ofs);

	if (total_partitions > 1)
		set_block_bits(pBlock_bytes, pResults->m_partition, (total_partitions == 64) ? 6 : 4, &cur_bit_ofs);

	const uint32_t total_comps = (best_mode >= 4) ? 4 : 3;
	for (uint32_t comp = 0; comp < total_comps; comp++)
	{
		for (uint32_t subset = 0; subset < total_subsets; subset++)
		{
			set_block_bits(pBlock_bytes, low[subset].m_c[comp], (comp == 3) ? g_bc7_alpha_precision_table[best_mode] : g_bc7_color_precision_table[best_mode], &cur_bit_ofs);
			set_block_bits(pBlock_bytes, high[subset].m_c[comp], (comp == 3) ? g_bc7_alpha_precision_table[best_mode] : g_bc7_color_precision_table[best_mode], &cur_bit_ofs);
		}
	}

	if (g_bc7_mode_has_p_bits[best_mode])
	{
		for (uint32_t subset = 0; subset < total_subsets; subset++)
		{
			set_block_bits(pBlock_bytes, pbits[subset][0], 1, &cur_bit_ofs);
			if (!g_bc7_mode_has_shared_p_bits[best_mode])
				set_block_bits(pBlock_bytes, pbits[subset][1], 1, &cur_bit_ofs);
		}
	}

	for (uint32_t y = 0; y < 4; y++)
	{
		for (uint32_t x = 0; x < 4; x++)
		{
			int idx = x + y * 4;

			uint32_t n = pResults->m_index_selector ? get_bc7_alpha_index_size(best_mode, pResults->m_index_selector) : get_bc7_color_index_size(best_mode, pResults->m_index_selector);

			if ((idx == anchor[0]) || (idx == anchor[1]) || (idx == anchor[2]))
				n--;

			set_block_bits(pBlock_bytes, pResults->m_index_selector ? alpha_selectors[idx] : color_selectors[idx], n, &cur_bit_ofs);
		}
	}

	if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
	{
		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				int idx = x + y * 4;

				uint32_t n = pResults->m_index_selector ? get_bc7_color_index_size(best_mode, pResults->m_index_selector) : get_bc7_alpha_index_size(best_mode, pResults->m_index_selector);

				if ((idx == anchor[0]) || (idx == anchor[1]) || (idx == anchor[2]))
					n--;

				set_block_bits(pBlock_bytes, pResults->m_index_selector ? color_selectors[idx] : alpha_selectors[idx], n, &cur_bit_ofs);
			}
		}
	}

	assert(cur_bit_ofs == 128);
}